

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_test_suite.cpp
# Opt level: O2

void jsonpath_tests(string *fpath)

{
  bool bVar1;
  type_conflict9 tVar2;
  ostream *poVar3;
  jsoncons *this;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar4;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  jsoncons *pjVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  result_options options;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_01;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_02;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_03;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_04;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_05;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_06;
  iterator this_01;
  iterator this_02;
  array_range_type aVar7;
  const_array_range_type cVar8;
  json actual;
  SourceLineInfo local_490;
  string expr;
  iterator local_460;
  iterator local_450;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  expression;
  json tests;
  AssertionHandler catchAssertionHandler;
  StringRef local_2a0;
  StringRef local_290;
  json actual_2;
  StringRef local_250;
  fstream is;
  byte abStack_220 [496];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Test ");
  poVar3 = std::operator<<(poVar3,(string *)fpath);
  std::operator<<(poVar3,'\n');
  std::fstream::fstream(&is,(string *)fpath,_S_out|_S_in);
  if ((abStack_220[(long)_is[-3]] & 5) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open ");
    poVar3 = std::operator<<(poVar3,(string *)fpath);
    std::operator<<(poVar3,"\n");
    exit(1);
  }
  memset(&catchAssertionHandler,0,0x148);
  jsoncons::basic_json_options<char>::basic_json_options
            ((basic_json_options<char> *)&catchAssertionHandler);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
            (&tests,(basic_istream<char,_std::char_traits<char>_> *)&is,
             (basic_json_decode_options<char> *)&catchAssertionHandler);
  jsoncons::basic_json_options<char>::~basic_json_options
            ((basic_json_options<char> *)&catchAssertionHandler);
  aVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                    (&tests);
  while( true ) {
    local_460 = aVar7.last_._M_current;
    this_01 = aVar7.first_._M_current;
    if (this_01._M_current == local_460._M_current) break;
    catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000005;
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)anon_var_dwarf_fbb2e3;
    this = (jsoncons *)
           jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                     (this_01._M_current,(string_view_type *)&catchAssertionHandler);
    catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000005;
    catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"csv_parser edge cases" + 0x10;
    pbVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                       (this_01._M_current,(string_view_type *)&catchAssertionHandler);
    cVar8 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      (pbVar4);
    while( true ) {
      local_450 = cVar8.last_._M_current;
      this_02 = cVar8.first_._M_current;
      if (this_02._M_current == local_450._M_current) break;
      catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0xa;
      catchAssertionHandler.m_assertionInfo.macroName.m_size =
           (long)"Unexpected EOF while parsing jsonpath expression" + 0x26;
      this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                operator[](this_02._M_current,(string_view_type *)&catchAssertionHandler);
      jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      as_string<std::allocator<char>>(&expr,this_00);
      catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000006;
      catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)anon_var_dwarf_1c2ad2d;
      bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (this_02._M_current,(string_view_type *)&catchAssertionHandler);
      if (bVar1) {
        expression._0_8_ = 6;
        expression.static_resources_._M_t.
        super___uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
              )anon_var_dwarf_1c2ad2d;
        pbVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           (this_02._M_current,(string_view_type *)&expression);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(pbVar4);
      }
      catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x4;
      catchAssertionHandler.m_assertionInfo.macroName.m_size = (size_type)anon_var_dwarf_1c2ad46;
      bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (this_02._M_current,(string_view_type *)&catchAssertionHandler);
      if (bVar1) {
        expression._0_8_ = 4;
        expression.static_resources_._M_t.
        super___uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
              )anon_var_dwarf_1c2ad46;
        pbVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           (this_02._M_current,(string_view_type *)&expression);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(pbVar4);
      }
      actual_2.field_0._0_8_ = expr._M_string_length;
      actual_2.field_0.json_const_pointer_.ref_._M_data =
           (reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            )(reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              )expr._M_dataplus._M_p;
      catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
      catchAssertionHandler.m_assertionInfo.macroName.m_size = 0;
      catchAssertionHandler.m_assertionInfo.lineInfo.file = (char *)0x0;
      jsoncons::jsonpath::
      make_expression<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                (&expression,(jsonpath *)&actual_2,(string_view_type *)&catchAssertionHandler,
                 (custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)expr._M_string_length);
      std::
      vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~vector((vector<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::custom_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)&catchAssertionHandler);
      catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000006;
      catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"expected == result" + 0xc;
      bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (this_02._M_current,(string_view_type *)&catchAssertionHandler);
      options = (result_options)this;
      if (bVar1) {
        jsoncons::jsonpath::
        jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
        ::evaluate((jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *)&actual,(const_reference)&expression,options);
        catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000006;
        catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"expected == result" + 0xc;
        pjVar5 = (jsoncons *)
                 jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                 operator[](this_02._M_current,(string_view_type *)&catchAssertionHandler);
        tVar2 = jsoncons::operator!=
                          (&actual,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                    *)pjVar5);
        if (tVar2) {
          catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x7;
          catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"Illegal comment" + 8;
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(this_02._M_current,(string_view_type *)&catchAssertionHandler);
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"\n");
            catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x7;
            catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"Illegal comment" + 8;
            pbVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     operator[](this_02._M_current,(string_view_type *)&catchAssertionHandler);
            pbVar6 = jsoncons::operator<<
                               ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,pbVar4);
            std::operator<<((ostream *)pbVar6,"\n");
          }
          poVar3 = std::operator<<((ostream *)&std::cout,"Input:\n");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&catchAssertionHandler,this,j);
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::dump((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&catchAssertionHandler,(basic_ostream<char,_std::char_traits<char>_> *)poVar3);
          std::operator<<(poVar3,"\n\n");
          jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                    ((basic_json_encode_options<char> *)
                     &catchAssertionHandler.m_assertionInfo.macroName.m_size);
          poVar3 = std::operator<<((ostream *)&std::cout,"Expression: ");
          poVar3 = std::operator<<(poVar3,(string *)&expr);
          std::operator<<(poVar3,"\n\n");
          poVar3 = std::operator<<((ostream *)&std::cout,"Actual: ");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&catchAssertionHandler,(jsoncons *)&actual,j_00);
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::dump((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&catchAssertionHandler,(basic_ostream<char,_std::char_traits<char>_> *)poVar3);
          std::operator<<(poVar3,"\n\n");
          jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                    ((basic_json_encode_options<char> *)
                     &catchAssertionHandler.m_assertionInfo.macroName.m_size);
          poVar3 = std::operator<<((ostream *)&std::cout,"Expected: ");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&catchAssertionHandler,pjVar5,j_01);
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::dump((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&catchAssertionHandler,(basic_ostream<char,_std::char_traits<char>_> *)poVar3);
          std::operator<<(poVar3,"\n\n");
          jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                    ((basic_json_encode_options<char> *)
                     &catchAssertionHandler.m_assertionInfo.macroName.m_size);
        }
        actual_2.field_0._0_8_ = anon_var_dwarf_880c;
        actual_2.field_0.int64_.val_ = 5;
        local_490.file =
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
        ;
        local_490.line = (size_t)&DAT_00000049;
        Catch::StringRef::StringRef(&local_250,"expected == actual");
        Catch::AssertionHandler::AssertionHandler
                  (&catchAssertionHandler,(StringRef *)&actual_2,&local_490,local_250,
                   ContinueOnFailure);
        local_490.file = (char *)pjVar5;
        Catch::
        ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
        operator==((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)&actual_2,
                   (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                    *)&local_490,&actual);
        Catch::AssertionHandler::handleExpr
                  (&catchAssertionHandler,(ITransientExpression *)&actual_2);
        Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&actual_2);
        Catch::AssertionHandler::complete(&catchAssertionHandler);
        Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  (&actual);
      }
      catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x4;
      catchAssertionHandler.m_assertionInfo.macroName.m_size =
           (long)
           "Expected index, single or double quoted name, expression, filter, absolute (\'$\') path or relative (\'@\') path"
           + 0x68;
      bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (this_02._M_current,(string_view_type *)&catchAssertionHandler);
      if (bVar1) {
        jsoncons::jsonpath::
        jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
        ::evaluate((jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *)&actual,(const_reference)&expression,options);
        catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x4;
        catchAssertionHandler.m_assertionInfo.macroName.m_size =
             (long)
             "Expected index, single or double quoted name, expression, filter, absolute (\'$\') path or relative (\'@\') path"
             + 0x68;
        pjVar5 = (jsoncons *)
                 jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                 operator[](this_02._M_current,(string_view_type *)&catchAssertionHandler);
        tVar2 = jsoncons::operator!=
                          (&actual,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                    *)pjVar5);
        if (tVar2) {
          catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x7;
          catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"Illegal comment" + 8;
          bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(this_02._M_current,(string_view_type *)&catchAssertionHandler);
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"\n");
            catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x7;
            catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"Illegal comment" + 8;
            pbVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     operator[](this_02._M_current,(string_view_type *)&catchAssertionHandler);
            pbVar6 = jsoncons::operator<<
                               ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,pbVar4);
            std::operator<<((ostream *)pbVar6,"\n");
          }
          poVar3 = std::operator<<((ostream *)&std::cout,"Input:\n");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&catchAssertionHandler,this,j_02);
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::dump((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&catchAssertionHandler,(basic_ostream<char,_std::char_traits<char>_> *)poVar3);
          std::operator<<(poVar3,"\n\n");
          jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                    ((basic_json_encode_options<char> *)
                     &catchAssertionHandler.m_assertionInfo.macroName.m_size);
          poVar3 = std::operator<<((ostream *)&std::cout,"Expression: ");
          poVar3 = std::operator<<(poVar3,(string *)&expr);
          std::operator<<(poVar3,"\n\n");
          poVar3 = std::operator<<((ostream *)&std::cout,"Actual: ");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&catchAssertionHandler,(jsoncons *)&actual,j_03);
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::dump((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&catchAssertionHandler,(basic_ostream<char,_std::char_traits<char>_> *)poVar3);
          std::operator<<(poVar3,"\n\n");
          jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                    ((basic_json_encode_options<char> *)
                     &catchAssertionHandler.m_assertionInfo.macroName.m_size);
          poVar3 = std::operator<<((ostream *)&std::cout,"Expected: ");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&catchAssertionHandler,pjVar5,j_04);
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::dump((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&catchAssertionHandler,(basic_ostream<char,_std::char_traits<char>_> *)poVar3);
          std::operator<<(poVar3,"\n\n");
          jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                    ((basic_json_encode_options<char> *)
                     &catchAssertionHandler.m_assertionInfo.macroName.m_size);
        }
        actual_2.field_0._0_8_ = anon_var_dwarf_880c;
        actual_2.field_0.int64_.val_ = 5;
        local_490.file =
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
        ;
        local_490.line = 0x5c;
        Catch::StringRef::StringRef(&local_290,"expected == actual");
        Catch::AssertionHandler::AssertionHandler
                  (&catchAssertionHandler,(StringRef *)&actual_2,&local_490,local_290,
                   ContinueOnFailure);
        local_490.file = (char *)pjVar5;
        Catch::
        ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
        operator==((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)&actual_2,
                   (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                    *)&local_490,&actual);
        Catch::AssertionHandler::handleExpr
                  (&catchAssertionHandler,(ITransientExpression *)&actual_2);
        Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&actual_2);
        Catch::AssertionHandler::complete(&catchAssertionHandler);
        Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  (&actual);
      }
      catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000005;
      catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"Unidentified error" + 0xd;
      bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (this_02._M_current,(string_view_type *)&catchAssertionHandler);
      if (bVar1) {
        jsoncons::jsonpath::
        jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
        ::evaluate((jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *)&actual_2,(const_reference)&expression,options);
        catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x7;
        catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"Illegal comment" + 8;
        bVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                          (this_02._M_current,(string_view_type *)&catchAssertionHandler);
        if (bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Comment: ");
          catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x7;
          catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"Illegal comment" + 8;
          pbVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                   operator[](this_02._M_current,(string_view_type *)&catchAssertionHandler);
          pbVar6 = jsoncons::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,pbVar4);
          std::operator<<((ostream *)pbVar6,"\n");
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Error: ");
        catchAssertionHandler.m_assertionInfo.macroName.m_start = &DAT_00000005;
        catchAssertionHandler.m_assertionInfo.macroName.m_size = (long)"Unidentified error" + 0xd;
        pbVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                 operator[](this_02._M_current,(string_view_type *)&catchAssertionHandler);
        pbVar6 = jsoncons::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,pbVar4)
        ;
        std::operator<<((ostream *)pbVar6,"\n\n");
        poVar3 = std::operator<<((ostream *)&std::cout,"Input:\n");
        jsoncons::
        pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)&catchAssertionHandler,this,j_05);
        jsoncons::
        json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::dump((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)&catchAssertionHandler,(basic_ostream<char,_std::char_traits<char>_> *)poVar3);
        std::operator<<(poVar3,"\n\n");
        jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                  ((basic_json_encode_options<char> *)
                   &catchAssertionHandler.m_assertionInfo.macroName.m_size);
        poVar3 = std::operator<<((ostream *)&std::cout,"Expression: ");
        poVar3 = std::operator<<(poVar3,(string *)&expr);
        std::operator<<(poVar3,"\n\n");
        poVar3 = std::operator<<((ostream *)&std::cout,"Actual: ");
        jsoncons::
        pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)&catchAssertionHandler,(jsoncons *)&actual_2,j_06);
        jsoncons::
        json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::dump((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)&catchAssertionHandler,(basic_ostream<char,_std::char_traits<char>_> *)poVar3);
        std::operator<<(poVar3,"\n\n");
        jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
                  ((basic_json_encode_options<char> *)
                   &catchAssertionHandler.m_assertionInfo.macroName.m_size);
        actual.field_0._0_8_ = anon_var_dwarf_880c;
        actual.field_0.int64_.val_ = 5;
        local_490.file =
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
        ;
        local_490.line = 0x69;
        Catch::StringRef::StringRef(&local_2a0,"false");
        Catch::AssertionHandler::AssertionHandler
                  (&catchAssertionHandler,(StringRef *)&actual,&local_490,local_2a0,
                   ContinueOnFailure);
        actual.field_0._0_8_ = actual.field_0._0_8_ & 0xffffffffffffff00;
        Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&actual);
        Catch::AssertionHandler::complete(&catchAssertionHandler);
        Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&actual_2);
      }
      std::
      unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~unique_ptr(&expression.static_resources_);
      std::__cxx11::string::~string((string *)&expr);
      cVar8.last_._M_current = local_450._M_current;
      cVar8.first_._M_current = this_02._M_current + 1;
    }
    aVar7.last_._M_current = local_460._M_current;
    aVar7.first_._M_current = this_01._M_current + 1;
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&tests);
  std::fstream::~fstream(&is);
  return;
}

Assistant:

void jsonpath_tests(const std::string& fpath)
{
    std::cout << "Test " << fpath << '\n';

    std::fstream is(fpath);
    if (!is)
    {
        std::cerr << "Cannot open " << fpath << "\n";
        exit(1);
    }

    json tests = json::parse(is);
    for (const auto& test_group : tests.array_range())
    {
        const json& instance = test_group["given"];

        for (const auto& test_case : test_group["cases"].array_range())
        {
            std::string expr = test_case["expression"].as<std::string>();
            try
            {
                jsonpath::result_options options = jsonpath::result_options();
                if (test_case.contains("nodups") && test_case.at("nodups").as<bool>())
                {
                    options |= jsonpath::result_options::nodups;
                }
                if (test_case.contains("sort") && test_case.at("sort").as<bool>())
                {
                    options |= jsonpath::result_options::sort;
                }
                auto expression = jsoncons::jsonpath::make_expression<json>(expr);
                if (test_case.contains("result"))
                {
                    jsonpath::result_options rflags = options | jsonpath::result_options::value;
                    json actual = expression.evaluate(instance, rflags);
                    const json& expected = test_case["result"];
                    //std::cout << "actual\n:" << actual << "\n";
                    if (actual != expected)
                    {
                        if (test_case.contains("comment"))
                        {
                            std::cout << "\n" << test_case["comment"] << "\n";
                        }
                        std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                        std::cout << "Expression: " << expr << "\n\n";
                        std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                        std::cout << "Expected: " << pretty_print(expected) << "\n\n";
                    }
                    CHECK(expected == actual);
                }
                if (test_case.contains("path"))
                {
                    jsonpath::result_options pflags = options | jsonpath::result_options::path;
                    json actual = expression.evaluate(instance, pflags);
                    const json& expected = test_case["path"];
                    //std::cout << "actual\n:" << actual << "\n";
                    if (actual != expected)
                    {
                        if (test_case.contains("comment"))
                        {
                            std::cout << "\n" << test_case["comment"] << "\n";
                        }
                        std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                        std::cout << "Expression: " << expr << "\n\n";
                        std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                        std::cout << "Expected: " << pretty_print(expected) << "\n\n";
                    }
                    CHECK(expected == actual);
                }
                if (test_case.contains("error"))
                {
                    json actual = expression.evaluate(instance);
                    if (test_case.contains("comment"))
                    {
                        std::cout << "Comment: " << test_case["comment"] << "\n";
                    }
                    std::cout << "Error: " << test_case["error"] << "\n\n";
                    std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                    std::cout << "Expression: " << expr << "\n\n";
                    std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                    CHECK(false);
                }

            }
            catch (const std::exception& e)
            {
                if (test_case.contains("result"))
                {
                    std::cout << e.what() << "\n";
                    const json& expected = test_case["result"];
                    std::cout << e.what() << "\n";
                    if (test_case.contains("comment"))
                    {
                        std::cout << "Comment: " << test_case["comment"] << "\n\n";
                    }
                    std::cout << "Input\n" << pretty_print(instance) << "\n\n";
                    std::cout << "Expression: " << expr << "\n\n";
                    std::cout << "Expected: " << expected << "\n\n";
                    CHECK(false);
                }
            }
        }
    }
}